

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<embree::avx::PresplitItem,_unsigned_int>::tbbRadixIteration1
          (ParallelRadixSort<embree::avx::PresplitItem,_unsigned_int> *this,uint shift,
          PresplitItem *src,PresplitItem *dst,size_t threadIndex,size_t threadCount)

{
  size_t sVar1;
  PresplitItem PVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  TyRadixCount *pauVar5;
  ulong uVar6;
  TyRadixCount *pauVar7;
  long lVar8;
  size_t i_4;
  uint uVar9;
  ulong uVar10;
  size_t i_1;
  size_t sVar11;
  uint offset [256];
  uint total [256];
  uint local_880 [4];
  undefined1 auStack_870 [1008];
  int local_480 [4];
  undefined1 auStack_470 [1112];
  
  sVar1 = this->N;
  for (uVar6 = 0; uVar6 < 0x100; uVar6 = uVar6 + 8) {
    *(undefined1 (*) [32])(local_480 + uVar6) = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  uVar6 = (sVar1 * threadIndex) / threadCount;
  pauVar5 = this->radixCount;
  pauVar7 = pauVar5;
  for (sVar11 = 0; sVar11 != threadCount; sVar11 = sVar11 + 1) {
    for (uVar10 = 0; uVar10 < 0x100; uVar10 = uVar10 + 8) {
      auVar3 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar7 + uVar10 + 4),
                          *(undefined1 (*) [16])(auStack_470 + uVar10 * 4));
      auVar4 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar7 + uVar10),
                          *(undefined1 (*) [16])(local_480 + uVar10));
      *(undefined1 (*) [16])(local_480 + uVar10) = auVar4;
      *(undefined1 (*) [16])(auStack_470 + uVar10 * 4) = auVar3;
    }
    pauVar7 = pauVar7 + 1;
  }
  local_880[0] = 0;
  uVar9 = 0;
  for (lVar8 = 1; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    uVar9 = uVar9 + local_480[lVar8 + -1];
    local_880[lVar8] = uVar9;
  }
  for (sVar11 = 0; sVar11 != threadIndex; sVar11 = sVar11 + 1) {
    for (uVar10 = 0; uVar10 < 0x100; uVar10 = uVar10 + 8) {
      auVar3 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar5 + uVar10 + 4),
                          *(undefined1 (*) [16])(auStack_870 + uVar10 * 4));
      auVar4 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar5 + uVar10),
                          *(undefined1 (*) [16])(local_880 + uVar10));
      *(undefined1 (*) [16])(local_880 + uVar10) = auVar4;
      *(undefined1 (*) [16])(auStack_870 + uVar10 * 4) = auVar3;
    }
    pauVar5 = pauVar5 + 1;
  }
  for (; uVar6 < ((threadIndex + 1) * sVar1) / threadCount; uVar6 = uVar6 + 1) {
    PVar2 = src[uVar6];
    uVar10 = ((ulong)PVar2 & 0xffffffff) >> ((byte)shift & 0x3f) & 0xff;
    uVar9 = local_880[uVar10];
    local_880[uVar10] = uVar9 + 1;
    dst[uVar9] = PVar2;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }